

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_utils.cpp
# Opt level: O2

bool FileSysUtilsParsePathList
               (string *path_list,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *paths)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar1 = std::__cxx11::string::find((char)path_list,0x3a);
  while (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)path_list);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)paths,&local_50)
    ;
    std::__cxx11::string::~string((string *)&local_50);
    lVar1 = std::__cxx11::string::find((char)path_list,0x3a);
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)path_list);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)paths,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return true;
}

Assistant:

bool FileSysUtilsParsePathList(std::string& path_list, std::vector<std::string>& paths) {
    std::string::size_type start = 0;
    std::string::size_type location = path_list.find(PATH_SEPARATOR);
    while (location != std::string::npos) {
        paths.push_back(path_list.substr(start, location));
        start = location + 1;
        location = path_list.find(PATH_SEPARATOR, start);
    }
    paths.push_back(path_list.substr(start, location));
    return true;
}